

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# demangle.cc
# Opt level: O0

bool absl::lts_20240722::debugging_internal::ParseCVQualifiers(State *state)

{
  bool bVar1;
  bool bVar2;
  bool bVar3;
  int local_28;
  int num_cv_qualifiers;
  ComplexityGuard guard;
  State *state_local;
  
  guard.state_ = state;
  anon_unknown_3::ComplexityGuard::ComplexityGuard((ComplexityGuard *)&num_cv_qualifiers,state);
  bVar1 = anon_unknown_3::ComplexityGuard::IsTooComplex((ComplexityGuard *)&num_cv_qualifiers);
  if (bVar1) {
    state_local._7_1_ = false;
  }
  else {
    local_28 = 0;
    while( true ) {
      bVar1 = ParseExtendedQualifier(guard.state_);
      if (!bVar1) break;
      local_28 = local_28 + 1;
    }
    bVar1 = ParseOneCharToken(guard.state_,'r');
    bVar2 = ParseOneCharToken(guard.state_,'V');
    bVar3 = ParseOneCharToken(guard.state_,'K');
    state_local._7_1_ = 0 < (int)((uint)bVar3 + local_28 + (uint)bVar1 + (uint)bVar2);
  }
  anon_unknown_3::ComplexityGuard::~ComplexityGuard((ComplexityGuard *)&num_cv_qualifiers);
  return state_local._7_1_;
}

Assistant:

static bool ParseCVQualifiers(State *state) {
  ComplexityGuard guard(state);
  if (guard.IsTooComplex()) return false;
  int num_cv_qualifiers = 0;
  while (ParseExtendedQualifier(state)) ++num_cv_qualifiers;
  num_cv_qualifiers += ParseOneCharToken(state, 'r');
  num_cv_qualifiers += ParseOneCharToken(state, 'V');
  num_cv_qualifiers += ParseOneCharToken(state, 'K');
  return num_cv_qualifiers > 0;
}